

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&> * __thiscall
Catch::ExprLhs<protozero::data_view_const&>::operator==
          (BinaryExpr<const_protozero::data_view_&,_const_protozero::data_view_&>
           *__return_storage_ptr__,ExprLhs<protozero::data_view_const&> *this,data_view *rhs)

{
  data_view *pdVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = compareEqual<protozero::data_view,protozero::data_view>(*(data_view **)this,rhs);
  pdVar1 = *(data_view **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0019c658;
  __return_storage_ptr__->m_lhs = pdVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }